

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

uint8_t __thiscall icu_63::Normalizer2Impl::getCC(Normalizer2Impl *this,uint16_t norm16)

{
  uint8_t uVar1;
  
  if (norm16 < 0xfc00) {
    uVar1 = '\0';
    if ((this->minNoNo <= norm16) && (norm16 < this->limitNoNo)) {
      if ((*(byte *)((long)this->extraData + (ulong)(norm16 & 0xfffe)) & 0x80) == 0) {
        return '\0';
      }
      return (uint8_t)this->extraData[(ulong)(norm16 >> 1) - 1];
    }
  }
  else {
    uVar1 = (uint8_t)(norm16 >> 1);
  }
  return uVar1;
}

Assistant:

uint8_t getCC(uint16_t norm16) const {
        if(norm16>=MIN_NORMAL_MAYBE_YES) {
            return getCCFromNormalYesOrMaybe(norm16);
        }
        if(norm16<minNoNo || limitNoNo<=norm16) {
            return 0;
        }
        return getCCFromNoNo(norm16);
    }